

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlUnmarshall.c
# Opt level: O1

JL_STATUS UnmarshallDictionary
                    (JlDataObject *DictionaryObject,JlMarshallElement *StructDescription,
                    size_t StructDescriptionCount,_Bool IgnoreExistingValuesInStruct,void *Structure
                    ,size_t *pErrorAtPos)

{
  size_t __n;
  JlDataObject *StringObject;
  JL_STATUS JVar1;
  JL_DATA_TYPE JVar2;
  uint32_t uVar3;
  size_t sVar4;
  size_t ListCount;
  undefined7 in_register_00000009;
  uint32_t i;
  void *pvVar5;
  ulong uVar6;
  JlMarshallElement *pJVar7;
  ulong uVar8;
  void **listPtr;
  undefined8 *Output;
  undefined8 *puVar9;
  ulong uVar10;
  bool bVar11;
  uint8_t *data;
  JlDataObject *object;
  JlListItem *enumerator;
  JlDataObject *local_a0;
  undefined4 local_94;
  JlDataObject *local_90;
  undefined8 *local_88;
  size_t local_80;
  JlDataObject *local_78;
  JlListItem *local_70;
  void *local_68;
  size_t local_60;
  size_t local_58;
  size_t local_50;
  void *local_48;
  JlMarshallElement *local_40;
  JlDataObject *local_38;
  
  local_94 = (undefined4)CONCAT71(in_register_00000009,IgnoreExistingValuesInStruct);
  if (StructDescriptionCount == 0) {
    JVar1 = JL_STATUS_SUCCESS;
  }
  else {
    uVar8 = 0;
    local_80 = StructDescriptionCount;
    local_68 = Structure;
    local_40 = StructDescription;
    local_38 = DictionaryObject;
    do {
      pJVar7 = local_40;
      local_90 = (JlDataObject *)0x0;
      JVar1 = JlGetObjectFromDictionaryByKey(local_38,local_40[uVar8].Name,&local_90);
      if (JVar1 == JL_STATUS_SUCCESS) {
        pJVar7 = pJVar7 + uVar8;
        Output = (undefined8 *)(pJVar7->FieldOffset + (long)Structure);
        JVar2 = JlGetObjectType(local_90);
        StringObject = local_90;
        if ((JVar2 == JL_DATA_TYPE_LIST & pJVar7->IsArray) == 1) {
          uVar3 = JlGetListCount(local_90);
          JVar1 = JlMemoryVerifyCountFieldLargeEnoughForValue(pJVar7->CountFieldSize,(ulong)uVar3);
          if (JVar1 == JL_STATUS_SUCCESS) {
            pvVar5 = (void *)(pJVar7->CountFieldOffset + (long)Structure);
            sVar4 = pJVar7->CountFieldSize;
            local_78 = local_90;
            uVar3 = JlGetListCount(local_90);
            local_88 = (undefined8 *)CONCAT44(local_88._4_4_,uVar3);
            ListCount = JlMemoryReadCountValue(pvVar5,sVar4);
            local_50 = sVar4;
            local_48 = pvVar5;
            JlMemoryWriteCountValue(pvVar5,sVar4,0);
            if (((char)local_94 == '\0') && (ListCount != 0)) {
              FreeUnmarshalledList(pJVar7,Output,ListCount);
            }
            __n = pJVar7->ArrayFieldSize;
            if ((int)local_88 == 0) {
              if (__n == 0) {
                *Output = 0;
                JVar1 = JL_STATUS_SUCCESS;
              }
              else {
                JVar1 = JL_STATUS_SUCCESS;
                memset(Output,0,__n);
              }
            }
            else {
              uVar10 = (ulong)local_88 & 0xffffffff;
              if (__n == 0) {
                puVar9 = (undefined8 *)WjTestLib_Calloc(pJVar7->ArrayItemSize * uVar10,1);
                if (puVar9 == (undefined8 *)0x0) {
                  JVar1 = JL_STATUS_OUT_OF_MEMORY;
                  puVar9 = (undefined8 *)0x0;
                }
                else {
                  *Output = puVar9;
                  JVar1 = JL_STATUS_SUCCESS;
                }
              }
              else {
                memset(Output,0,__n);
                bVar11 = pJVar7->ArrayFieldSize / pJVar7->ArrayItemSize < uVar10;
                puVar9 = Output;
                if (bVar11) {
                  puVar9 = (undefined8 *)0x0;
                }
                JVar1 = JL_STATUS_SUCCESS;
                if (bVar11) {
                  JVar1 = JL_STATUS_TOO_MANY_ITEMS;
                }
              }
              if (JVar1 == JL_STATUS_SUCCESS) {
                local_70 = (JlListItem *)0x0;
                uVar6 = 0;
                local_58 = 0;
                local_88 = puVar9;
                do {
                  sVar4 = pJVar7->ArrayItemSize;
                  local_a0 = (JlDataObject *)0x0;
                  JVar1 = JlGetObjectListNextItem(local_78,&local_a0,&local_70);
                  if (JVar1 == JL_STATUS_SUCCESS) {
                    JVar2 = JlGetObjectType(local_a0);
                    if (pJVar7->Type == JVar2) {
                      JVar1 = UnmarshalObject(local_a0,pJVar7,(_Bool)(char)local_94,
                                              (undefined8 *)(sVar4 * uVar6 + (long)local_88),
                                              pErrorAtPos);
                      if (JVar1 == JL_STATUS_SUCCESS) {
                        local_58 = local_58 + 1;
                        JlMemoryWriteCountValue(local_48,local_50,local_58);
                        JVar1 = JL_STATUS_SUCCESS;
                      }
                    }
                    else {
                      JVar1 = JL_STATUS_WRONG_TYPE;
                      if (pErrorAtPos != (size_t *)0x0) {
                        sVar4 = JlGetObjectTag(local_a0);
                        *pErrorAtPos = sVar4;
                      }
                    }
                  }
                  uVar6 = uVar6 + 1;
                } while ((uVar6 < uVar10) && (JVar1 == JL_STATUS_SUCCESS));
              }
            }
            Structure = local_68;
            if ((pErrorAtPos != (size_t *)0x0) &&
               ((JVar1 != JL_STATUS_SUCCESS && (*pErrorAtPos == 0)))) {
              sVar4 = JlGetObjectTag(local_78);
              *pErrorAtPos = sVar4;
            }
          }
          StructDescriptionCount = local_80;
          if (((pErrorAtPos != (size_t *)0x0) && (JVar1 != JL_STATUS_SUCCESS)) &&
             (*pErrorAtPos == 0)) {
            sVar4 = JlGetObjectTag(local_90);
            *pErrorAtPos = sVar4;
          }
        }
        else if (pJVar7->Type == JVar2) {
          if (pJVar7->IsBase64 == true) {
            pvVar5 = (void *)(pJVar7->CountFieldOffset + (long)Structure);
            local_88 = (undefined8 *)pJVar7->CountFieldSize;
            local_70 = (JlListItem *)0x0;
            puVar9 = Output;
            if (pJVar7->FieldSize != 0) {
              puVar9 = (undefined8 *)0x0;
            }
            if ((((_Bool)(char)local_94 == false) && (pJVar7->FieldSize == 0)) &&
               ((void *)*puVar9 != (void *)0x0)) {
              WjTestLib_Free((void *)*puVar9);
              *puVar9 = 0;
            }
            local_78 = StringObject;
            JVar1 = JlGetObjectString(StringObject,(char **)&local_70);
            if (JVar1 == JL_STATUS_SUCCESS) {
              local_a0 = (JlDataObject *)0x0;
              local_60 = 0;
              if (local_70 == (JlListItem *)0x0) {
                JVar1 = JL_STATUS_INVALID_DATA;
                if (pJVar7->FieldSize == 0) {
                  *puVar9 = 0;
                  JVar1 = JlMemoryWriteCountValue(pvVar5,(size_t)local_88,0);
                }
              }
              else {
                JVar1 = JlBase64Decode((char *)local_70,&local_a0,&local_60);
                if (JVar1 == JL_STATUS_SUCCESS) {
                  if (pJVar7->FieldSize == 0) {
                    *puVar9 = local_a0;
                    JVar1 = JlMemoryWriteCountValue(pvVar5,(size_t)local_88,local_60);
                    if (JVar1 == JL_STATUS_SUCCESS) {
                      JVar1 = JL_STATUS_SUCCESS;
                    }
                    else {
                      *puVar9 = 0;
                      WjTestLib_Free(local_a0);
                      local_a0 = (JlDataObject *)0x0;
                    }
                  }
                  else {
                    JVar1 = JL_STATUS_INVALID_DATA;
                    if (local_60 == pJVar7->FieldSize) {
                      memcpy(Output,local_a0,local_60);
                      JVar1 = JL_STATUS_SUCCESS;
                    }
                    WjTestLib_Free(local_a0);
                    local_a0 = (JlDataObject *)0x0;
                  }
                }
              }
            }
            StructDescriptionCount = local_80;
            Structure = local_68;
            if ((pErrorAtPos != (size_t *)0x0) && (JVar1 != JL_STATUS_SUCCESS)) {
              sVar4 = JlGetObjectTag(local_78);
              *pErrorAtPos = sVar4;
              StructDescriptionCount = local_80;
              Structure = local_68;
            }
          }
          else {
            JVar1 = UnmarshalObject(local_90,pJVar7,(_Bool)(char)local_94,Output,pErrorAtPos);
            StructDescriptionCount = local_80;
          }
        }
        else {
          StructDescriptionCount = local_80;
          JVar1 = JL_STATUS_WRONG_TYPE;
          if (pErrorAtPos != (size_t *)0x0) {
            sVar4 = JlGetObjectTag(local_90);
            *pErrorAtPos = sVar4;
            StructDescriptionCount = local_80;
          }
        }
      }
      else if (JVar1 == JL_STATUS_NOT_FOUND) {
        JVar1 = JL_STATUS_SUCCESS;
      }
      uVar8 = (ulong)((int)uVar8 + 1);
    } while ((uVar8 < StructDescriptionCount) && (JVar1 == JL_STATUS_SUCCESS));
  }
  return JVar1;
}

Assistant:

static
JL_STATUS
    UnmarshallDictionary
    (
        JlDataObject const*         DictionaryObject,
        JlMarshallElement const*    StructDescription,
        size_t                      StructDescriptionCount,
        bool                        IgnoreExistingValuesInStruct,
        void*                       Structure,
        size_t*                     pErrorAtPos
    )
{
    JL_STATUS jlStatus = JL_STATUS_SUCCESS;

    for( uint32_t i=0; i<StructDescriptionCount && JL_STATUS_SUCCESS==jlStatus; i++ )
    {
        JlMarshallElement const* currentItem = &StructDescription[i];

        // Get object
        JlDataObject* object = NULL;
        JL_DATA_TYPE objectType = JL_DATA_TYPE_NONE;

        jlStatus = JlGetObjectFromDictionaryByKey( DictionaryObject, currentItem->Name, &object );
        if( JL_STATUS_SUCCESS == jlStatus )
        {
            void* elementInStruct = (void*)(((uint8_t*)Structure)+currentItem->FieldOffset);
            objectType = JlGetObjectType( object );

            if( currentItem->IsArray && JL_DATA_TYPE_LIST == objectType )
            {
                // First verify that the count field is large enough
                size_t arrayCount = JlGetListCount( object );
                jlStatus = JlMemoryVerifyCountFieldLargeEnoughForValue( currentItem->CountFieldSize, arrayCount );
                if( JL_STATUS_SUCCESS == jlStatus )
                {
                    // Unmarshall the list
                    void* arrayCountPtr = ((uint8_t*)Structure) + currentItem->CountFieldOffset;
                    jlStatus = UnmarshalList(
                        object,
                        currentItem,
                        IgnoreExistingValuesInStruct,
                        elementInStruct,
                        arrayCountPtr,
                        currentItem->CountFieldSize,
                        pErrorAtPos );
                }

                if( JL_STATUS_SUCCESS != jlStatus )
                {
                    if( NULL != pErrorAtPos && 0 == *pErrorAtPos )
                    {
                        *pErrorAtPos = JlGetObjectTag( object );
                    }
                }
            }
            else if( currentItem->Type == objectType )
            {
                if( currentItem->IsBase64 )
                {
                    void* dataSizeElementInStruct = (void*)(((uint8_t*)Structure)+currentItem->CountFieldOffset);
                    jlStatus = UnmarshalBinary( object, dataSizeElementInStruct, currentItem->CountFieldSize, currentItem, IgnoreExistingValuesInStruct, elementInStruct, pErrorAtPos );
                }
                else
                {
                    jlStatus = UnmarshalObject( object, currentItem, IgnoreExistingValuesInStruct, elementInStruct, pErrorAtPos );
                }
            }
            else
            {
                // Wrong type
                jlStatus = JL_STATUS_WRONG_TYPE;
                if( NULL != pErrorAtPos )
                {
                    *pErrorAtPos = JlGetObjectTag( object );
                }
            }

        }
        else if( JL_STATUS_NOT_FOUND == jlStatus )
        {
            // Keyname not found in dictionary. Do not consider this an error, we just don't have any value for this item, so we leave
            // it as default
            jlStatus = JL_STATUS_SUCCESS;
        }
    }

    return jlStatus;
}